

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc-1123_type.h
# Opt level: O3

bool date::rfc1123::validate(parts *dt)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ushort uVar8;
  ushort uVar9;
  byte bVar10;
  ushort uVar11;
  
  uVar3 = dt->year;
  if (uVar3 == 0) {
    return false;
  }
  bVar1 = dt->month;
  if ((byte)(bVar1 - 0xd) < 0xf4) {
    return false;
  }
  bVar2 = dt->day;
  if (bVar2 == 0) {
    return false;
  }
  uVar8 = (ushort)bVar1;
  if (bVar1 < 0xc) {
    bVar10 = 0x1e;
    if ((0xa50U >> (uVar8 & 0x1f) & 1) != 0) goto LAB_00107796;
    if (uVar8 == 2) {
      bVar10 = 0x1c;
      if ((uVar3 & 3) == 0) {
        bVar10 = ((ushort)((ushort)(uVar3 * 0x5c29) >> 4 | uVar3 * -0x7000) < 0xa4 ||
                 0x28f < (ushort)((ushort)(uVar3 * 0x5c29) >> 2 | uVar3 * 0x4000)) | 0x1c;
      }
      goto LAB_00107796;
    }
  }
  bVar10 = 0x1f;
LAB_00107796:
  bVar4 = false;
  if ((((bVar2 <= bVar10) && (dt->hour < 0x18)) && (dt->minute < 0x3c)) && (dt->second < 0x3c)) {
    uVar9 = dt->offset_in_minutes;
    uVar11 = -uVar9;
    if (0 < (short)uVar9) {
      uVar11 = uVar9;
    }
    if (0x1797 < uVar11) {
      return false;
    }
    if (dt->week_day != '\0') {
      uVar9 = uVar8 + 0xc;
      if (bVar1 >= 3) {
        uVar9 = uVar8;
      }
      uVar5 = (uint)uVar3 - (uint)(bVar1 < 3);
      iVar6 = (uVar5 & 0xffff) / 400 + (((uVar5 >> 2) + uVar5 * 0x16d) - (uVar5 & 0xffff) / 100) +
              (int)((short)(uVar9 * 0x99 + -0x1c9) / 5);
      iVar7 = iVar6 + (uint)bVar2;
      iVar6 = (int)((ulong)((long)(int)((uint)bVar2 + iVar6 + 1) * -0x6db6db6d) >> 0x20) + iVar7 + 1
      ;
      if (dt->week_day !=
          (week_day_type)(((char)(iVar6 >> 2) - (char)(iVar6 >> 0x1f)) * -7 + (char)iVar7 + '\x02'))
      {
        return false;
      }
    }
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

static bool validate(const parts& dt)
    {
        if (dt.year == 0)
            return false;
        if (dt.month == 0 || dt.month > 12)
            return false;
        if (dt.day == 0 || dt.day > calendar_helper::days_in_month(dt.year, dt.month))
            return false;
        if (dt.hour > 23)
            return false;
        if (dt.minute > 59)
            return false;
        if (dt.second > 59)
            return false;
        if (std::abs(dt.offset_in_minutes) > 6039)
            return false;
        if (dt.week_day != 0)
        {
            const auto week_day = calendar_helper::day_of_week(calendar_helper::date{ dt.year, dt.month, dt.day });
            if (dt.week_day != week_day)
                return false;
        }
        return true;
    }